

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O3

_Bool ws_contains_word(char *phrase,char *word)

{
  char cVar1;
  int iVar2;
  size_t n;
  
  n = strlen(word);
  if (phrase != (char *)0x0) {
    cVar1 = *phrase;
    while (cVar1 != '\0') {
      iVar2 = nni_strncasecmp(phrase,word,n);
      if (((iVar2 == 0) && ((ulong)(byte)phrase[n] < 0x2d)) &&
         ((0x100100000001U >> ((ulong)(byte)phrase[n] & 0x3f) & 1) != 0)) {
        return true;
      }
      phrase = strchr(phrase,0x20);
      if (phrase == (char *)0x0) {
        return false;
      }
      for (; (*phrase == ',' || (*phrase == ' ')); phrase = phrase + 1) {
      }
      cVar1 = *phrase;
    }
  }
  return false;
}

Assistant:

static bool
ws_contains_word(const char *phrase, const char *word)
{
	size_t len = strlen(word);

	while ((phrase != NULL) && (*phrase != '\0')) {
		if ((nni_strncasecmp(phrase, word, len) == 0) &&
		    ((phrase[len] == 0) || (phrase[len] == ' ') ||
		        (phrase[len] == ','))) {
			return (true);
		}
		// Skip to next word.
		if ((phrase = strchr(phrase, ' ')) != NULL) {
			while ((*phrase == ' ') || (*phrase == ',')) {
				phrase++;
			}
		}
	}
	return (false);
}